

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Interpolater.cpp
# Opt level: O0

void __thiscall
amrex::CellConservativeLinear::interp
          (CellConservativeLinear *this,FArrayBox *crse,int crse_comp,FArrayBox *fine,int fine_comp,
          int ncomp,Box *fine_region,IntVect *ratio,Geometry *crse_geom,Geometry *fine_geom,
          Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcr,int param_12,int param_13,
          RunOn runon)

{
  anon_class_224_7_6f8cafc1 *f;
  long in_RCX;
  int in_EDX;
  long in_RSI;
  long *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  undefined8 in_stack_00000008;
  undefined8 *in_stack_00000010;
  Geometry *in_stack_00000018;
  int in_stack_00000040;
  Array4<const_double> *ctmp;
  Array4<double> *tmp;
  Elixir cceli;
  FArrayBox ccfab;
  BCRec *bcrp;
  AsyncArray<amrex::BCRec,_0> async_bcr;
  Box result;
  Box *cslope_bx;
  Box *crse_region;
  Array4<double> *finearr;
  Array4<const_double> *crsearr;
  Box *cdomain;
  bool run_on_gpu;
  Arena *in_stack_fffffffffffff6f8;
  undefined2 in_stack_fffffffffffff700;
  undefined1 in_stack_fffffffffffff702;
  undefined1 in_stack_fffffffffffff703;
  int in_stack_fffffffffffff704;
  undefined4 uVar1;
  Box *in_stack_fffffffffffff708;
  undefined4 in_stack_fffffffffffff710;
  undefined4 in_stack_fffffffffffff714;
  BaseFab<double> *in_stack_fffffffffffff728;
  undefined1 *puVar2;
  BCRec *local_8d0;
  anon_class_176_6_7011cc79 *f_00;
  int ncomp_00;
  undefined7 in_stack_fffffffffffff758;
  undefined1 uVar3;
  undefined1 local_8a0 [64];
  undefined4 local_860;
  undefined1 auStack_858 [64];
  undefined1 auStack_818 [64];
  int local_7d8;
  undefined4 local_7d4;
  undefined8 local_7d0;
  undefined4 local_7c8;
  undefined1 local_7c0 [64];
  undefined1 auStack_780 [64];
  int local_740;
  undefined4 local_73c;
  undefined8 local_738;
  undefined8 local_730;
  undefined8 local_728;
  uint local_720;
  undefined8 local_71c;
  undefined4 local_714;
  BCRec *local_710;
  undefined1 local_708 [64];
  undefined1 auStack_6c8 [64];
  int local_688;
  undefined4 local_684;
  undefined8 local_680;
  undefined8 local_678;
  undefined8 local_670;
  uint local_668;
  BCRec *local_660;
  Array4<const_double> local_658;
  Array4<const_double> *local_618;
  Array4<double> local_610;
  Array4<double> *local_5d0;
  undefined1 local_588 [16];
  double *local_578;
  undefined1 auStack_570 [12];
  int iStack_564;
  int local_560;
  int iStack_55c;
  int local_554;
  BCRec *local_540;
  AsyncArray<amrex::BCRec,_0> local_538;
  Box local_524;
  Box *local_508;
  undefined1 local_4fc [28];
  undefined1 *local_4e0;
  Array4<double> local_4d8;
  Array4<double> *local_498;
  undefined1 local_490 [136];
  long local_408;
  undefined1 *local_400;
  long local_3f8;
  undefined1 *local_3f0;
  BCRec *local_3e8;
  undefined1 *local_3e0;
  undefined4 local_3cc;
  undefined1 *local_3c8;
  Dim3 local_3c0;
  Dim3 local_3b0;
  Dim3 local_3a0;
  Dim3 local_390;
  int local_384;
  undefined8 *local_380;
  double *local_378;
  Dim3 local_370;
  Dim3 local_35c;
  Dim3 local_350;
  Dim3 local_340;
  int local_334;
  undefined8 *local_330;
  double *local_328;
  Dim3 local_320;
  undefined8 *local_310;
  undefined4 local_308;
  undefined4 uStack_304;
  int local_300;
  undefined4 local_2fc;
  undefined8 *local_2f8;
  undefined4 local_2ec;
  undefined8 *local_2e8;
  undefined4 local_2dc;
  undefined8 *local_2d8;
  Dim3 local_2d0;
  undefined8 *local_2c0;
  undefined4 local_2b8;
  undefined4 uStack_2b4;
  int local_2b0;
  undefined4 local_2ac;
  undefined8 *local_2a8;
  undefined4 local_29c;
  undefined8 *local_298;
  undefined4 local_28c;
  undefined8 *local_288;
  Dim3 local_280;
  undefined8 *local_270;
  int local_268;
  int iStack_264;
  int local_260;
  undefined4 local_25c;
  undefined1 *local_258;
  undefined4 local_24c;
  undefined1 *local_248;
  undefined4 local_23c;
  int *local_238;
  Dim3 local_230;
  undefined8 *local_220;
  int local_218;
  int iStack_214;
  int local_210;
  undefined4 local_20c;
  long local_208;
  undefined4 local_1fc;
  long local_1f8;
  undefined4 local_1ec;
  int *local_1e8;
  Dim3 local_1e0;
  Dim3 local_1cc;
  Dim3 local_1c0;
  Dim3 local_1b0;
  int local_1a4;
  undefined8 *local_1a0;
  double *local_198;
  Dim3 local_190;
  undefined8 *local_180;
  undefined4 local_178;
  undefined4 uStack_174;
  int local_170;
  undefined4 local_16c;
  undefined8 *local_168;
  undefined4 local_15c;
  undefined8 *local_158;
  undefined4 local_14c;
  undefined8 *local_148;
  Dim3 local_140;
  undefined8 *local_130;
  int local_128;
  int iStack_124;
  int local_120;
  undefined4 local_11c;
  long local_118;
  undefined4 local_10c;
  long local_108;
  undefined4 local_fc;
  int *local_f8;
  Dim3 local_f0;
  Dim3 local_e0 [2];
  Dim3 local_c0;
  undefined1 *local_b0;
  undefined1 *local_90;
  undefined4 local_7c;
  undefined1 *local_78;
  undefined4 local_6c;
  undefined1 *local_68;
  undefined4 local_5c;
  undefined1 *local_58;
  Dim3 local_50;
  undefined1 *local_40;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  int *local_28;
  undefined4 local_1c;
  int *local_18;
  undefined4 local_c;
  int *local_8;
  
  uVar3 = false;
  local_490._88_4_ = in_R9D;
  local_490._92_4_ = in_R8D;
  local_490._96_8_ = in_RCX;
  local_490._108_4_ = in_EDX;
  local_490._112_8_ = in_RSI;
  if (in_stack_00000040 == 0) {
    uVar3 = Gpu::inLaunchRegion();
  }
  local_490[0x57] = uVar3;
  local_490._72_8_ = Geometry::Domain(in_stack_00000018);
  local_408 = local_490._112_8_;
  local_378 = *(double **)(local_490._112_8_ + 0x10);
  local_380 = (undefined8 *)(local_490._112_8_ + 0x18);
  local_384 = *(int *)(local_490._112_8_ + 0x34);
  local_28c = 0;
  local_2b8 = *(undefined4 *)local_380;
  local_29c = 1;
  uStack_2b4 = *(undefined4 *)(local_490._112_8_ + 0x1c);
  local_3a0._0_8_ = *local_380;
  local_2ac = 2;
  local_3a0.z = *(int *)(local_490._112_8_ + 0x20);
  local_1e8 = (int *)(local_490._112_8_ + 0x24);
  local_1ec = 0;
  local_218 = *local_1e8 + 1;
  local_1f8 = local_490._112_8_ + 0x24;
  local_1fc = 1;
  iStack_214 = *(int *)(local_490._112_8_ + 0x28) + 1;
  local_208 = local_490._112_8_ + 0x24;
  local_20c = 2;
  local_3c0.z = *(int *)(local_490._112_8_ + 0x2c) + 1;
  local_3c0.y = iStack_214;
  local_3c0.x = local_218;
  f_00 = (anon_class_176_6_7011cc79 *)local_490;
  local_3b0._0_8_ = local_3c0._0_8_;
  local_3b0.z = local_3c0.z;
  local_390._0_8_ = local_3a0._0_8_;
  local_390.z = local_3a0.z;
  local_2d0._0_8_ = local_3a0._0_8_;
  local_2d0.z = local_3a0.z;
  local_2c0 = local_380;
  local_2b0 = local_3a0.z;
  local_2a8 = local_380;
  local_298 = local_380;
  local_288 = local_380;
  local_230._0_8_ = local_3c0._0_8_;
  local_230.z = local_3c0.z;
  local_220 = local_380;
  local_210 = local_3c0.z;
  Array4<const_double>::Array4
            ((Array4<const_double> *)f_00,local_378,&local_390,&local_3b0,local_384);
  local_3f8 = local_490._96_8_;
  local_198 = *(double **)(local_490._96_8_ + 0x10);
  local_1a0 = (undefined8 *)(local_490._96_8_ + 0x18);
  local_1a4 = *(int *)(local_490._96_8_ + 0x34);
  local_14c = 0;
  local_178 = *(undefined4 *)local_1a0;
  local_15c = 1;
  uStack_174 = *(undefined4 *)(local_490._96_8_ + 0x1c);
  local_1c0._0_8_ = *local_1a0;
  local_16c = 2;
  local_1c0.z = *(int *)(local_490._96_8_ + 0x20);
  local_f8 = (int *)(local_490._96_8_ + 0x24);
  local_fc = 0;
  local_128 = *local_f8 + 1;
  local_108 = local_490._96_8_ + 0x24;
  local_10c = 1;
  iStack_124 = *(int *)(local_490._96_8_ + 0x28) + 1;
  local_118 = local_490._96_8_ + 0x24;
  local_11c = 2;
  local_1e0.z = *(int *)(local_490._96_8_ + 0x2c) + 1;
  local_1e0.y = iStack_124;
  local_1e0.x = local_128;
  local_490._64_8_ = f_00;
  local_1cc._0_8_ = local_1e0._0_8_;
  local_1cc.z = local_1e0.z;
  local_1b0._0_8_ = local_1c0._0_8_;
  local_1b0.z = local_1c0.z;
  local_190._0_8_ = local_1c0._0_8_;
  local_190.z = local_1c0.z;
  local_180 = local_1a0;
  local_170 = local_1c0.z;
  local_168 = local_1a0;
  local_158 = local_1a0;
  local_148 = local_1a0;
  local_140._0_8_ = local_1e0._0_8_;
  local_140.z = local_1e0.z;
  local_130 = local_1a0;
  local_120 = local_1e0.z;
  Array4<double>::Array4(&local_4d8,local_198,&local_1b0,&local_1cc,local_1a4);
  local_498 = &local_4d8;
  (**(code **)(*in_RDI + 0x18))(local_4fc,in_RDI,in_stack_00000008,in_stack_00000010);
  local_4e0 = local_4fc;
  local_3cc = 0xffffffff;
  local_3c8 = local_4e0;
  Box::grow(&local_524,-1);
  local_508 = &local_524;
  f = (anon_class_224_7_6f8cafc1 *)
      std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::data
                ((vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0x132b2fd);
  Gpu::AsyncArray<amrex::BCRec,_0>::AsyncArray
            ((AsyncArray<amrex::BCRec,_0> *)
             CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
             (BCRec *)in_stack_fffffffffffff708,
             CONCAT44(in_stack_fffffffffffff704,
                      CONCAT13(in_stack_fffffffffffff703,
                               CONCAT12(in_stack_fffffffffffff702,in_stack_fffffffffffff700))));
  if ((local_490[0x57] & 1) == 0) {
    local_8d0 = std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::data
                          ((vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0x132b365);
  }
  else {
    local_8d0 = Gpu::AsyncArray<amrex::BCRec,_0>::data(&local_538);
  }
  local_540 = local_8d0;
  FArrayBox::FArrayBox
            ((FArrayBox *)CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
             in_stack_fffffffffffff708,in_stack_fffffffffffff704,(bool)in_stack_fffffffffffff703,
             (bool)in_stack_fffffffffffff702,in_stack_fffffffffffff6f8);
  Gpu::Elixir::Elixir((Elixir *)0x132b3b2);
  if ((local_490[0x57] & 1) != 0) {
    BaseFab<double>::elixir<double,_0>(in_stack_fffffffffffff728);
    Gpu::Elixir::operator=
              ((Elixir *)
               CONCAT44(in_stack_fffffffffffff704,
                        CONCAT13(in_stack_fffffffffffff703,
                                 CONCAT12(in_stack_fffffffffffff702,in_stack_fffffffffffff700))),
               (Elixir *)in_stack_fffffffffffff6f8);
    Gpu::Elixir::~Elixir
              ((Elixir *)
               CONCAT44(in_stack_fffffffffffff704,
                        CONCAT13(in_stack_fffffffffffff703,
                                 CONCAT12(in_stack_fffffffffffff702,in_stack_fffffffffffff700))));
  }
  puVar2 = local_588;
  local_b0 = auStack_570;
  local_5c = 0;
  local_6c = 1;
  local_7c = 2;
  local_8 = &iStack_564;
  local_c = 0;
  local_38 = iStack_564 + 1;
  local_18 = &iStack_564;
  local_1c = 1;
  iStack_34 = local_560 + 1;
  local_28 = &iStack_564;
  local_2c = 2;
  local_f0.z = iStack_55c + 1;
  local_f0.y = iStack_34;
  local_f0.x = local_38;
  local_400 = puVar2;
  local_e0[0]._0_8_ = local_f0._0_8_;
  local_e0[0].z = local_f0.z;
  local_90 = local_b0;
  local_78 = local_b0;
  local_68 = local_b0;
  local_58 = local_b0;
  local_50._0_8_ = local_f0._0_8_;
  local_50.z = local_f0.z;
  local_40 = local_b0;
  local_30 = local_f0.z;
  Array4<double>::Array4(&local_610,local_578,&local_c0,local_e0,local_554);
  local_328 = *(double **)(puVar2 + 0x10);
  local_330 = (undefined8 *)(puVar2 + 0x18);
  local_334 = *(int *)(puVar2 + 0x34);
  local_2dc = 0;
  local_308 = *(undefined4 *)local_330;
  local_2ec = 1;
  uStack_304 = *(undefined4 *)(puVar2 + 0x1c);
  local_350._0_8_ = *local_330;
  local_2fc = 2;
  local_350.z = *(int *)(puVar2 + 0x20);
  local_238 = (int *)(puVar2 + 0x24);
  local_23c = 0;
  local_268 = *local_238 + 1;
  local_248 = puVar2 + 0x24;
  local_24c = 1;
  iStack_264 = *(int *)(puVar2 + 0x28) + 1;
  local_258 = puVar2 + 0x24;
  local_25c = 2;
  local_370.z = *(int *)(puVar2 + 0x2c) + 1;
  local_370.y = iStack_264;
  local_370.x = local_268;
  local_5d0 = &local_610;
  local_490._128_8_ = puVar2;
  local_35c._0_8_ = local_370._0_8_;
  local_35c.z = local_370.z;
  local_340._0_8_ = local_350._0_8_;
  local_340.z = local_350.z;
  local_320._0_8_ = local_350._0_8_;
  local_320.z = local_350.z;
  local_310 = local_330;
  local_300 = local_350.z;
  local_2f8 = local_330;
  local_2e8 = local_330;
  local_2d8 = local_330;
  local_280._0_8_ = local_370._0_8_;
  local_280.z = local_370.z;
  local_270 = local_330;
  local_260 = local_370.z;
  Array4<const_double>::Array4(&local_658,local_328,&local_340,&local_35c,local_334);
  local_618 = &local_658;
  if ((*(byte *)(in_RDI + 1) & 1) == 0) {
    local_3e8 = (BCRec *)&stack0x00000040;
    memcpy(local_7c0,local_5d0,0x3c);
    ncomp_00 = (int)((ulong)in_RDI >> 0x20);
    memcpy(auStack_780,(void *)local_490._64_8_,0x3c);
    local_740 = local_490._108_4_;
    local_73c = local_490._88_4_;
    local_738 = *(undefined8 *)((IntVect *)local_490._72_8_)->vect;
    local_730 = *(undefined8 *)(((IntVect *)local_490._72_8_)->vect + 2);
    local_728 = *(undefined8 *)(((IntVect *)(local_490._72_8_ + 0xc))->vect + 1);
    local_720 = ((IndexType *)(local_490._72_8_ + 0x18))->itype;
    local_71c = *in_stack_00000010;
    local_714 = *(undefined4 *)(in_stack_00000010 + 1);
    local_710 = local_540;
    LoopConcurrentOnCpu<amrex::CellConservativeLinear::interp(amrex::FArrayBox_const&,int,amrex::FArrayBox&,int,int,amrex::Box_const&,amrex::IntVect_const&,amrex::Geometry_const&,amrex::Geometry_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int,amrex::RunOn)::__1>
              ((Box *)CONCAT17(uVar3,in_stack_fffffffffffff758),ncomp_00,
               (anon_class_184_7_a9878c3f *)f);
  }
  else {
    local_3e0 = (undefined1 *)&stack0x00000040;
    memcpy(local_708,local_5d0,0x3c);
    ncomp_00 = (int)((ulong)in_RDI >> 0x20);
    memcpy(auStack_6c8,(void *)local_490._64_8_,0x3c);
    local_688 = local_490._108_4_;
    local_684 = local_490._88_4_;
    local_680 = *(undefined8 *)((IntVect *)local_490._72_8_)->vect;
    local_678 = *(undefined8 *)(((IntVect *)local_490._72_8_)->vect + 2);
    local_670 = *(undefined8 *)(((IntVect *)(local_490._72_8_ + 0xc))->vect + 1);
    local_668 = ((IndexType *)(local_490._72_8_ + 0x18))->itype;
    local_660 = local_540;
    LoopConcurrentOnCpu<amrex::CellConservativeLinear::interp(amrex::FArrayBox_const&,int,amrex::FArrayBox&,int,int,amrex::Box_const&,amrex::IntVect_const&,amrex::Geometry_const&,amrex::Geometry_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int,amrex::RunOn)::__0>
              ((Box *)f,f_00);
  }
  local_3f0 = (undefined1 *)&stack0x00000040;
  uVar1 = local_490._88_4_;
  memcpy(local_8a0,local_498,0x3c);
  local_860 = local_490._92_4_;
  memcpy(auStack_858,local_618,0x3c);
  memcpy(auStack_818,(void *)local_490._64_8_,0x3c);
  local_7d8 = local_490._108_4_;
  local_7d4 = local_490._88_4_;
  local_7d0 = *in_stack_00000010;
  local_7c8 = *(undefined4 *)(in_stack_00000010 + 1);
  LoopConcurrentOnCpu<amrex::CellConservativeLinear::interp(amrex::FArrayBox_const&,int,amrex::FArrayBox&,int,int,amrex::Box_const&,amrex::IntVect_const&,amrex::Geometry_const&,amrex::Geometry_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int,amrex::RunOn)::__2>
            ((Box *)CONCAT17(uVar3,in_stack_fffffffffffff758),ncomp_00,f);
  Gpu::Elixir::~Elixir
            ((Elixir *)
             CONCAT44(uVar1,CONCAT13(in_stack_fffffffffffff703,
                                     CONCAT12(in_stack_fffffffffffff702,in_stack_fffffffffffff700)))
            );
  FArrayBox::~FArrayBox((FArrayBox *)0x132bc08);
  Gpu::AsyncArray<amrex::BCRec,_0>::~AsyncArray((AsyncArray<amrex::BCRec,_0> *)0x132bc15);
  return;
}

Assistant:

void
CellConservativeLinear::interp (const FArrayBox& crse,
                                int              crse_comp,
                                FArrayBox&       fine,
                                int              fine_comp,
                                int              ncomp,
                                const Box&       fine_region,
                                const IntVect&   ratio,
                                const Geometry&  crse_geom,
                                const Geometry&  fine_geom,
                                Vector<BCRec> const& bcr,
                                int              /*actual_comp*/,
                                int              /*actual_state*/,
                                RunOn             runon)
{
    BL_PROFILE("CellConservativeLinear::interp()");
    BL_ASSERT(bcr.size() >= ncomp);

    AMREX_ASSERT(fine.box().contains(fine_region));

    bool run_on_gpu = (runon == RunOn::Gpu && Gpu::inLaunchRegion());

    Box const& cdomain = crse_geom.Domain();
    amrex::ignore_unused(fine_geom);

    Array4<Real const> const& crsearr = crse.const_array();
    Array4<Real> const& finearr = fine.array();

    const Box& crse_region = CoarseBox(fine_region,ratio);
    const Box& cslope_bx = amrex::grow(crse_region,-1);

    AsyncArray<BCRec> async_bcr(bcr.data(), (run_on_gpu) ? ncomp : 0);
    BCRec const* bcrp = (run_on_gpu) ? async_bcr.data() : bcr.data();

    FArrayBox ccfab(cslope_bx, ncomp*AMREX_SPACEDIM);
    Elixir cceli;
    if (run_on_gpu) cceli = ccfab.elixir();
    Array4<Real> const& tmp = ccfab.array();
    Array4<Real const> const& ctmp = ccfab.const_array();

#if (AMREX_SPACEDIM == 1)
    if (crse_geom.IsSPHERICAL()) {
        Real drf = fine_geom.CellSize(0);
        Real rlo = fine_geom.Offset(0);
        if (do_linear_limiting) {
            AMREX_HOST_DEVICE_PARALLEL_FOR_3D_FLAG(runon, cslope_bx, i, j, k,
            {
                mf_cell_cons_lin_interp_llslope(i,j,k, tmp, crsearr, crse_comp, ncomp,
                                                cdomain, bcrp);
            });
        } else {
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(runon, cslope_bx, ncomp, i, j, k, n,
            {
                amrex::ignore_unused(j,k);
                mf_cell_cons_lin_interp_mcslope_sph(i, n, tmp, crsearr, crse_comp, ncomp,
                                                    cdomain, ratio, bcrp, drf, rlo);
            });
        }

        AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(runon, fine_region, ncomp, i, j, k, n,
        {
            amrex::ignore_unused(j,k);
            mf_cell_cons_lin_interp_sph(i, n, finearr, fine_comp, ctmp,
                                        crsearr, crse_comp, ncomp, ratio, drf, rlo);
        });
    } else
#elif (AMREX_SPACEDIM == 2)
    if (crse_geom.IsRZ()) {
        Real drf = fine_geom.CellSize(0);
        Real rlo = fine_geom.Offset(0);
        if (do_linear_limiting) {
            AMREX_HOST_DEVICE_PARALLEL_FOR_3D_FLAG(runon, cslope_bx, i, j, k,
            {
                mf_cell_cons_lin_interp_llslope(i,j,k, tmp, crsearr, crse_comp, ncomp,
                                                cdomain, bcrp);
            });
        } else {
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(runon, cslope_bx, ncomp, i, j, k, n,
            {
                amrex::ignore_unused(k);
                mf_cell_cons_lin_interp_mcslope_rz(i, j, n, tmp, crsearr, crse_comp, ncomp,
                                                   cdomain, ratio, bcrp, drf, rlo);
            });
        }

        AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(runon, fine_region, ncomp, i, j, k, n,
        {
            amrex::ignore_unused(k);
            mf_cell_cons_lin_interp_rz(i, j, n, finearr, fine_comp, ctmp,
                                       crsearr, crse_comp, ncomp, ratio, drf, rlo);
        });
    } else
#endif
    {
        if (do_linear_limiting) {
            AMREX_HOST_DEVICE_PARALLEL_FOR_3D_FLAG(runon, cslope_bx, i, j, k,
            {
                mf_cell_cons_lin_interp_llslope(i,j,k, tmp, crsearr, crse_comp, ncomp,
                                                cdomain, bcrp);
            });
        } else {
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(runon, cslope_bx, ncomp, i, j, k, n,
            {
                mf_cell_cons_lin_interp_mcslope(i,j,k,n, tmp, crsearr, crse_comp, ncomp,
                                                cdomain, ratio, bcrp);
            });
        }

        AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(runon, fine_region, ncomp, i, j, k, n,
        {
            mf_cell_cons_lin_interp(i,j,k,n, finearr, fine_comp, ctmp,
                                    crsearr, crse_comp, ncomp, ratio);
        });
    }
}